

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall
StringType::GenCheckingCStr(StringType *this,Output *out_cc,Env *env,DataPtr *data,string *str_size)

{
  string *psVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Output *in_RSI;
  long in_RDI;
  string str_val;
  string local_78 [24];
  string *in_stack_ffffffffffffffa0;
  DataPtr *in_stack_ffffffffffffffa8;
  Env *in_stack_ffffffffffffffb0;
  Output *in_stack_ffffffffffffffb8;
  StringType *in_stack_ffffffffffffffc0;
  
  Type::GenBoundaryCheck
            (&in_stack_ffffffffffffffc0->super_Type,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  psVar1 = ConstString::str_abi_cxx11_(*(ConstString **)(in_RDI + 400));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,(string *)psVar1);
  pcVar2 = DataPtr::ptr_expr((DataPtr *)0x14b981);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  Output::println(in_RSI,"if ( memcmp(%s, %s, %s) != 0 )",pcVar2,uVar3,uVar4);
  Output::inc_indent(in_RSI);
  Output::println(in_RSI,"{");
  std::__cxx11::string::string(local_78,(string *)&stack0xffffffffffffffb8);
  GenStringMismatch(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_78);
  Output::println(in_RSI,"}");
  Output::dec_indent(in_RSI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void StringType::GenCheckingCStr(Output* out_cc, Env* env, const DataPtr& data,
                                 const string& str_size)
	{
	// TODO: extend it for dynamic strings
	ASSERT(type_ == CSTR);

	GenBoundaryCheck(out_cc, env, data);

	string str_val = str_->str();

	// Compare the string and report error on mismatch
	out_cc->println("if ( memcmp(%s, %s, %s) != 0 )", data.ptr_expr(), str_val.c_str(),
	                str_size.c_str());
	out_cc->inc_indent();
	out_cc->println("{");
	GenStringMismatch(out_cc, env, data, str_val);
	out_cc->println("}");
	out_cc->dec_indent();
	}